

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

void opensshcert_freekey(ssh_key *key)

{
  opensshcert_key *ck;
  ssh_key *key_local;
  
  if (key[-1].vt != (ssh_keyalg *)0x0) {
    ssh_key_free((ssh_key *)key[-1].vt);
  }
  strbuf_free((strbuf *)key[-0xd].vt);
  strbuf_free((strbuf *)key[-10].vt);
  strbuf_free((strbuf *)key[-9].vt);
  strbuf_free((strbuf *)key[-6].vt);
  strbuf_free((strbuf *)key[-5].vt);
  strbuf_free((strbuf *)key[-4].vt);
  strbuf_free((strbuf *)key[-3].vt);
  strbuf_free((strbuf *)key[-2].vt);
  safefree(key + -0xd);
  return;
}

Assistant:

static void opensshcert_freekey(ssh_key *key)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);

    /* If this function is called from one of the above constructors
     * because it failed part way through, we might not have managed
     * to construct ck->basekey, so it might be NULL. */
    if (ck->basekey)
        ssh_key_free(ck->basekey);

    strbuf_free(ck->nonce);
    strbuf_free(ck->key_id);
    strbuf_free(ck->valid_principals);
    strbuf_free(ck->critical_options);
    strbuf_free(ck->extensions);
    strbuf_free(ck->reserved);
    strbuf_free(ck->signature_key);
    strbuf_free(ck->signature);

    sfree(ck);
}